

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O3

bool __thiscall components::Inference::infer_wumpus(Inference *this,pair<int,_int> room)

{
  bool bVar1;
  pointer ppVar2;
  pair<int,_int> *ppVar3;
  pair<int,_int> *ppVar4;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> adjacent_rooms;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_50;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_38;
  
  get_adjacent_rooms(&local_50,(Inference *)room,room);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&local_38,&local_50);
  ppVar4 = local_38.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_38.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_38.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = true;
  }
  else {
    do {
      ppVar3 = ppVar4 + 1;
      bVar1 = KnowledgeBase::get_information_visited(this->current_kb,*ppVar4);
      ppVar4 = ppVar3;
    } while (bVar1 && ppVar3 != local_38.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_38.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int> *)0x0) {
    operator_delete(local_38.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = KnowledgeBase::get_information_stench
                      (this->current_kb,
                       *local_50.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    ppVar4 = local_50.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    ppVar2 = local_50.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar4 != local_50.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (bVar1 == false) {
          bVar1 = false;
        }
        else {
          bVar1 = KnowledgeBase::get_information_stench(this->current_kb,*ppVar4);
          ppVar2 = local_50.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        ppVar4 = ppVar4 + 1;
      } while (ppVar4 != ppVar2);
    }
  }
  if (local_50.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int> *)0x0) {
    operator_delete(local_50.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool Inference::infer_wumpus(std::pair<int, int> room){
  std::vector<std::pair<int, int>> adjacent_rooms = get_adjacent_rooms(room);
  if(!validate_conclusion(adjacent_rooms)) return false;

  bool conclusion = current_kb.get_information_stench(adjacent_rooms[0]);
  for(auto itr = adjacent_rooms.begin() + 1; itr != adjacent_rooms.end(); itr++){
    conclusion = conclusion && current_kb.get_information_stench(*itr);
  }
  return conclusion;
}